

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O0

void __thiscall
soplex::SoPlexBase<double>::_resolveWithoutPreprocessing
          (SoPlexBase<double> *this,Result simplificationStatus)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  SPxSolverBase<double> *pSVar7;
  VarStatus *pVVar8;
  VarStatus *pVVar9;
  long lVar10;
  long in_RDI;
  SPxSolverBase<double> *this_00;
  Verbosity old_verbosity;
  SPxException *E;
  VectorBase<double> redCost;
  VectorBase<double> dual;
  VectorBase<double> slacks;
  VectorBase<double> primal;
  undefined8 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  undefined8 in_stack_fffffffffffffe58;
  VectorBase<double> *in_stack_fffffffffffffe60;
  VarStatus *in_stack_fffffffffffffe68;
  SPxSolverBase<double> *in_stack_fffffffffffffe70;
  VectorBase<double> *in_stack_fffffffffffffef0;
  SPxSolverBase<double> *in_stack_fffffffffffffef8;
  bool *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff0c;
  undefined1 applySimplifier;
  SoPlexBase<double> *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined1 local_80 [24];
  undefined1 local_68 [40];
  undefined1 local_40 [24];
  undefined1 local_28 [40];
  
  applySimplifier = (undefined1)((uint)in_stack_ffffffffffffff0c >> 0x18);
  iVar6 = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  if (*(long *)(in_RDI + 0x1ce8) == 0) {
    if (*(long *)(in_RDI + 0x1cf0) != 0) {
      lVar10 = in_RDI + 0x4d70;
      numRows((SoPlexBase<double> *)0x423a4a);
      DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
                ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),iVar6);
      pVVar8 = (VarStatus *)(in_RDI + 0x4d88);
      numCols((SoPlexBase<double> *)0x423a71);
      DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
                ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),iVar6);
      pVVar9 = (VarStatus *)(in_RDI + 0x180);
      pSVar7 = (SPxSolverBase<double> *)
               DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr
                         ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)(in_RDI + 0x4d70));
      DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr
                ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)(in_RDI + 0x4d88));
      DataArray<soplex::SPxSolverBase<double>::VarStatus>::size
                ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)(in_RDI + 0x4d70));
      DataArray<soplex::SPxSolverBase<double>::VarStatus>::size
                ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)(in_RDI + 0x4d88));
      SPxSolverBase<double>::getBasis(pSVar7,pVVar9,pVVar8,(int)((ulong)lVar10 >> 0x20),(int)lVar10)
      ;
      *(undefined1 *)(in_RDI + 0x50d0) = 1;
    }
  }
  else {
    this_00 = (SPxSolverBase<double> *)(in_RDI + 0x180);
    SPxLPBase<double>::nCols((SPxLPBase<double> *)0x423370);
    VectorBase<double>::VectorBase
              (in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
    SPxLPBase<double>::nRows((SPxLPBase<double> *)0x42338c);
    VectorBase<double>::VectorBase
              (in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
    iVar3 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x4233bf);
    VectorBase<double>::VectorBase
              (in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
    iVar4 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x4233f2);
    VectorBase<double>::VectorBase
              (in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20));
    pSVar7 = (SPxSolverBase<double> *)(in_RDI + 0x4d70);
    numRows((SoPlexBase<double> *)0x42342f);
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
              ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),iVar6);
    in_stack_ffffffffffffff10 = (SoPlexBase<double> *)(in_RDI + 0x4d88);
    iVar5 = numCols((SoPlexBase<double> *)0x42346c);
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
              ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)
               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),iVar6);
    SPxSolverBase<double>::getPrimalSol(this_00,(VectorBase<double> *)CONCAT44(iVar3,iVar4));
    SPxSolverBase<double>::getSlacks
              (pSVar7,(VectorBase<double> *)CONCAT44(iVar5,in_stack_ffffffffffffff18));
    SPxSolverBase<double>::getDualSol(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    SPxSolverBase<double>::getRedCostSol
              (pSVar7,(VectorBase<double> *)CONCAT44(iVar5,in_stack_ffffffffffffff18));
    if ((*(long *)(in_RDI + 0x1cf0) != 0) &&
       (bVar2 = SPxLPBase<double>::isScaled((SPxLPBase<double> *)(in_RDI + 0x180)), bVar2)) {
      (**(code **)(**(long **)(in_RDI + 0x1cf0) + 0x110))
                (*(long **)(in_RDI + 0x1cf0),in_RDI + 0x180,local_28);
      (**(code **)(**(long **)(in_RDI + 0x1cf0) + 0x118))
                (*(long **)(in_RDI + 0x1cf0),in_RDI + 0x180,local_40);
      (**(code **)(**(long **)(in_RDI + 0x1cf0) + 0x120))
                (*(long **)(in_RDI + 0x1cf0),in_RDI + 0x180,local_68);
      (**(code **)(**(long **)(in_RDI + 0x1cf0) + 0x128))
                (*(long **)(in_RDI + 0x1cf0),in_RDI + 0x180,local_80);
    }
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr
              ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)(in_RDI + 0x4d70));
    in_stack_ffffffffffffff00 =
         (bool *)DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr
                           ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)(in_RDI + 0x4d88)
                           );
    iVar6 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::size
                      ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)(in_RDI + 0x4d70));
    applySimplifier = (undefined1)((uint)iVar6 >> 0x18);
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::size
              ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)(in_RDI + 0x4d88));
    SPxSolverBase<double>::getBasis
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
               (VarStatus *)in_stack_fffffffffffffe60,
               (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),(int)in_stack_fffffffffffffe58);
    plVar1 = *(long **)(in_RDI + 0x1ce8);
    pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr
                       ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)(in_RDI + 0x4d70));
    pVVar9 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr
                       ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)(in_RDI + 0x4d88));
    (**(code **)(*plVar1 + 0x30))(plVar1,local_28,local_68,local_40,local_80,pVVar8,pVVar9,0);
    plVar1 = *(long **)(in_RDI + 0x1ce8);
    pVVar8 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr
                       ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)(in_RDI + 0x4d70));
    pVVar9 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::get_ptr
                       ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)(in_RDI + 0x4d88));
    iVar6 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::size
                      ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)(in_RDI + 0x4d70));
    iVar3 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::size
                      ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)(in_RDI + 0x4d88));
    (**(code **)(*plVar1 + 0x78))(plVar1,pVVar8,pVVar9,iVar6,iVar3);
    *(undefined1 *)(in_RDI + 0x50d0) = 1;
    VectorBase<double>::~VectorBase((VectorBase<double> *)0x4239ab);
    VectorBase<double>::~VectorBase((VectorBase<double> *)0x4239b8);
    VectorBase<double>::~VectorBase((VectorBase<double> *)0x4239c5);
    VectorBase<double>::~VectorBase((VectorBase<double> *)0x4239d2);
  }
  _preprocessAndSolveReal(in_stack_ffffffffffffff10,(bool)applySimplifier,in_stack_ffffffffffffff00)
  ;
  return;
}

Assistant:

void SoPlexBase<R>::_resolveWithoutPreprocessing(typename SPxSimplifier<R>::Result
      simplificationStatus)
{
   assert(!_isRealLPLoaded || _scaler != nullptr);
   assert(_simplifier != nullptr || _scaler != nullptr);
   assert(_status == SPxSolverBase<R>::INFEASIBLE || _status == SPxSolverBase<R>::INForUNBD
          || _status == SPxSolverBase<R>::UNBOUNDED);

   // if simplifier was active, then we unsimplify to get the basis
   if(_simplifier)
   {
      assert(!_simplifier->isUnsimplified());
      assert(simplificationStatus == SPxSimplifier<R>::OKAY);

      // get temporary solution vectors for transformed problem
      VectorBase<R> primal(_solver.nCols());
      VectorBase<R> slacks(_solver.nRows());
      VectorBase<R> dual(_solver.nRows());
      VectorBase<R> redCost(_solver.nCols());

      _basisStatusRows.reSize(numRows());
      _basisStatusCols.reSize(numCols());
      assert(_basisStatusRows.size() >= _solver.nRows());
      assert(_basisStatusCols.size() >= _solver.nCols());

      // get solution data from transformed problem
      _solver.getPrimalSol(primal);
      _solver.getSlacks(slacks);
      _solver.getDualSol(dual);
      _solver.getRedCostSol(redCost);

      // unscale vectors
      if(_scaler && _solver.isScaled())
      {
         _scaler->unscalePrimal(_solver, primal);
         _scaler->unscaleSlacks(_solver, slacks);
         _scaler->unscaleDual(_solver, dual);
         _scaler->unscaleRedCost(_solver, redCost);
      }

      // get basis of transformed problem
      _solver.getBasis(_basisStatusRows.get_ptr(), _basisStatusCols.get_ptr(), _basisStatusRows.size(),
                       _basisStatusCols.size());

      try
      {
         _simplifier->unsimplify(primal, dual, slacks, redCost, _basisStatusRows.get_ptr(),
                                 _basisStatusCols.get_ptr(), false);
         _simplifier->getBasis(_basisStatusRows.get_ptr(), _basisStatusCols.get_ptr(),
                               _basisStatusRows.size(), _basisStatusCols.size());
         _hasBasis = true;
      }
      catch(const SPxException& E)
      {
         SPX_MSG_INFO1(spxout, spxout << "Caught exception <" << E.what() <<
                       "> during unsimplification. Resolving without simplifier and scaler.\n");
         _hasBasis = false;
      }
   }
   // if the original problem is not in the solver because of scaling, we also need to store the basis
   else if(_scaler != nullptr)
   {
      _basisStatusRows.reSize(numRows());
      _basisStatusCols.reSize(numCols());
      assert(_basisStatusRows.size() == _solver.nRows());
      assert(_basisStatusCols.size() == _solver.nCols());

      _solver.getBasis(_basisStatusRows.get_ptr(), _basisStatusCols.get_ptr(), _basisStatusRows.size(),
                       _basisStatusCols.size());
      _hasBasis = true;
   }

   // resolve the original problem
   _preprocessAndSolveReal(false);
   return;
}